

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * CTcPrsOpUnary::parse_delete(CTcPrsNode *subexpr)

{
  CTcPrsNode *pCVar1;
  
  if ((G_prs->field_0xec & 4) == 0) {
    CTcTokenizer::log_warning(0x2aff);
  }
  pCVar1 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x10);
  pCVar1[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)subexpr;
  (pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00315160;
  return pCVar1;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_delete(CTcPrsNode *subexpr)
{
    /* the delete operator is obsolete in TADS 3 - warn about it */
    if (!G_prs->get_syntax_only())
        G_tok->log_warning(TCERR_DELETE_OBSOLETE);

    /* create the deletion node */
    return new CTPNDelete(subexpr);
}